

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LLT.h
# Opt level: O3

Index Eigen::internal::llt_inplace<double,1>::
      unblocked<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,false>>
                (Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false> *mat)

{
  ResScalar *res;
  PointerType pdVar1;
  ulong uVar2;
  double *pdVar3;
  char *__function;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  double *pdVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  Index size;
  ulong uVar11;
  ulong cols;
  long lVar12;
  double dVar13;
  undefined8 extraout_XMM0_Qb;
  double dVar14;
  undefined1 auVar15 [16];
  undefined4 uVar16;
  undefined4 uVar17;
  const_blas_data_mapper<double,_long,_0> local_a0;
  const_blas_data_mapper<double,_long,_1> local_90;
  ulong local_80;
  undefined1 local_78 [16];
  long local_60;
  long local_58;
  Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false> *local_50;
  ulong local_48;
  long local_40;
  long local_38;
  
  uVar6 = (mat->
          super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>).
          super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
          super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>.
          super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>.
          m_rows.m_value;
  if (uVar6 != (mat->
               super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>
               ).
               super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
               super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>
               .
               super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>
               .m_cols.m_value) {
    __assert_fail("mat.rows()==mat.cols()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/MacWen[P]CMAES/include/../3rdParty/Eigen/src/Cholesky/LLT.h"
                  ,0x136,
                  "static Index Eigen::internal::llt_inplace<double, 1>::unblocked(MatrixType &) [Scalar = double, UpLo = 1, MatrixType = Eigen::Block<Eigen::Matrix<double, -1, -1>>]"
                 );
  }
  if (0 < (long)uVar6) {
    lVar9 = -1;
    lVar10 = 8;
    local_38 = 0;
    cols = 0;
    local_80 = uVar6;
    local_50 = mat;
    local_48 = uVar6;
    do {
      pdVar1 = (mat->
               super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>
               ).
               super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
               super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>
               .
               super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>
               .m_data;
      uVar11 = ~cols + local_48;
      if ((long)uVar11 < 0 && pdVar1 != (PointerType)0x0) {
        __assert_fail("(dataPtr == 0) || ( rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols))"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/MacWen[P]CMAES/include/../3rdParty/Eigen/src/Core/MapBase.h"
                      ,0xb0,
                      "Eigen::MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double, -1, -1>>, -1, 1>, 0>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<Eigen::Block<Eigen::Matrix<double, -1, -1>>, -1, 1>, Level = 0]"
                     );
      }
      if ((((long)uVar11 < 0) ||
          (lVar12 = (mat->
                    super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>
                    ).
                    super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>
                    .
                    super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>
                    .
                    super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>
                    .m_rows.m_value, (long)(lVar12 - uVar11) <= (long)cols)) ||
         ((mat->
          super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>).
          super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
          super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>.
          super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>.
          m_cols.m_value <= (long)cols)) {
        __function = 
        "Eigen::Block<Eigen::Block<Eigen::Matrix<double, -1, -1>>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Block<Eigen::Matrix<double, -1, -1>>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
        ;
LAB_0011371e:
        __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/MacWen[P]CMAES/include/../3rdParty/Eigen/src/Core/Block.h"
                      ,0x93,__function);
      }
      if (lVar12 <= (long)cols) {
        __function = 
        "Eigen::Block<Eigen::Block<Eigen::Matrix<double, -1, -1>>, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Block<Eigen::Matrix<double, -1, -1>>, BlockRows = 1, BlockCols = -1, InnerPanel = false]"
        ;
        goto LAB_0011371e;
      }
      local_40 = (mat->
                 super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>
                 ).
                 super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>
                 .m_outerStride;
      lVar12 = local_40 * cols;
      pdVar7 = pdVar1 + cols;
      dVar13 = pdVar1[lVar12 + cols];
      if (cols != 0) {
        dVar14 = *pdVar7 * *pdVar7;
        if (cols != 1) {
          pdVar3 = (double *)(local_38 + local_40 * 8 + (long)pdVar1);
          lVar4 = lVar9;
          do {
            dVar14 = dVar14 + *pdVar3 * *pdVar3;
            pdVar3 = pdVar3 + local_40;
            lVar4 = lVar4 + -1;
          } while (lVar4 != 0);
        }
        dVar13 = dVar13 - dVar14;
      }
      if (dVar13 <= 0.0) {
        return cols;
      }
      local_60 = lVar9;
      local_58 = lVar10;
      if (dVar13 < 0.0) {
        local_78._0_8_ = pdVar7;
        dVar13 = sqrt(dVar13);
        uVar16 = (undefined4)extraout_XMM0_Qb;
        uVar17 = (undefined4)((ulong)extraout_XMM0_Qb >> 0x20);
        pdVar7 = (double *)local_78._0_8_;
        mat = local_50;
      }
      else {
        uVar16 = 0;
        uVar17 = 0;
        dVar13 = SQRT(dVar13);
      }
      res = pdVar1 + cols + 1 + lVar12;
      (mat->super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>).
      super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>.m_data
      [(mat->super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>)
       .super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
       m_outerStride * cols + cols] = dVar13;
      if (uVar11 == 0 || cols == 0) {
        if (uVar11 != 0) goto LAB_001135fb;
      }
      else {
        local_a0.super_blas_data_mapper<const_double,_long,_0,_0>.m_stride = local_40;
        local_90.super_blas_data_mapper<const_double,_long,_1,_0>.m_stride = local_40;
        local_78._8_4_ = uVar16;
        local_78._0_8_ = dVar13;
        local_78._12_4_ = uVar17;
        local_a0.super_blas_data_mapper<const_double,_long,_0,_0>.m_data = pdVar1 + cols + 1;
        local_90.super_blas_data_mapper<const_double,_long,_1,_0>.m_data = pdVar7;
        general_matrix_vector_product<long,_double,_Eigen::internal::const_blas_data_mapper<double,_long,_0>,_0,_false,_double,_Eigen::internal::const_blas_data_mapper<double,_long,_1>,_false,_0>
        ::run(uVar11,cols,&local_a0,&local_90,res,1,-1.0);
        mat = local_50;
        dVar13 = (double)local_78._0_8_;
LAB_001135fb:
        uVar2 = (ulong)((uint)((ulong)res >> 3) & 1);
        if (((ulong)res & 7) != 0) {
          uVar2 = uVar11;
        }
        if (uVar2 != 0) {
          lVar9 = local_40 * local_38 + local_58;
          uVar5 = 0;
          do {
            *(double *)((long)pdVar1 + uVar5 * 8 + lVar9) =
                 *(double *)((long)pdVar1 + uVar5 * 8 + lVar9) / dVar13;
            uVar5 = uVar5 + 1;
          } while (uVar2 != uVar5);
        }
        lVar10 = uVar11 - uVar2;
        uVar5 = lVar10 - (lVar10 >> 0x3f) & 0xfffffffffffffffe;
        lVar9 = uVar5 + uVar2;
        if (1 < lVar10) {
          lVar10 = (local_40 + 1) * local_38;
          uVar8 = uVar2;
          do {
            auVar15._8_8_ = dVar13;
            auVar15._0_8_ = dVar13;
            auVar15 = divpd(*(undefined1 (*) [16])((long)pdVar1 + uVar8 * 8 + lVar10 + 8),auVar15);
            *(undefined1 (*) [16])((long)pdVar1 + uVar8 * 8 + lVar10 + 8) = auVar15;
            uVar8 = uVar8 + 2;
          } while ((long)uVar8 < lVar9);
        }
        if (lVar9 < (long)uVar11) {
          uVar11 = uVar2 + uVar5 + 1;
          lVar9 = (local_40 + 1) * local_38;
          do {
            *(double *)((long)pdVar1 + uVar11 * 8 + lVar9) =
                 *(double *)((long)pdVar1 + uVar11 * 8 + lVar9) / dVar13;
            uVar11 = uVar11 + 1;
          } while (uVar6 != uVar11);
        }
      }
      cols = cols + 1;
      lVar9 = local_60 + 1;
      local_38 = local_38 + 8;
      lVar10 = local_58 + 8;
      uVar6 = uVar6 - 1;
    } while (cols != local_80);
  }
  return -1;
}

Assistant:

static Index unblocked(MatrixType& mat)
  {
    using std::sqrt;

    eigen_assert(mat.rows()==mat.cols());
    const Index size = mat.rows();
    for(Index k = 0; k < size; ++k)
    {
      Index rs = size-k-1; // remaining size

      Block<MatrixType,Dynamic,1> A21(mat,k+1,k,rs,1);
      Block<MatrixType,1,Dynamic> A10(mat,k,0,1,k);
      Block<MatrixType,Dynamic,Dynamic> A20(mat,k+1,0,rs,k);

      RealScalar x = numext::real(mat.coeff(k,k));
      if (k>0) x -= A10.squaredNorm();
      if (x<=RealScalar(0))
        return k;
      mat.coeffRef(k,k) = x = sqrt(x);
      if (k>0 && rs>0) A21.noalias() -= A20 * A10.adjoint();
      if (rs>0) A21 /= x;
    }
    return -1;
  }